

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::BNTest_BadModulus_Test>::CreateTest
          (TestFactoryImpl<(anonymous_namespace)::BNTest_BadModulus_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__BNTest_006d5b38;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }